

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

FmsInt CompareScalarData(FmsScalarType stype,FmsInt size,void *lhs,void *rhs)

{
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  undefined4 in_EDI;
  double dVar1;
  FmsInt i_3;
  FmsInt N_3;
  double *rhs_data_3;
  double *lhs_data_3;
  FmsInt i_2;
  FmsInt N_2;
  float *rhs_data_2;
  float *lhs_data_2;
  FmsInt i_1;
  FmsInt N_1;
  double *rhs_data_1;
  double *lhs_data_1;
  FmsInt i;
  FmsInt N;
  float *rhs_data;
  float *lhs_data;
  FmsInt isDifferent;
  ulong local_b0;
  ulong local_90;
  ulong local_70;
  ulong local_50;
  FmsInt local_30;
  FmsInt local_8;
  
  if (in_RDX == in_RCX) {
    local_8 = 0;
  }
  else if (in_RDX == 0) {
    local_8 = 1;
  }
  else if (in_RCX == 0) {
    local_8 = 1;
  }
  else {
    switch(in_EDI) {
    case 0:
      local_30 = 0;
      for (local_50 = 0; local_50 < in_RSI; local_50 = local_50 + 1) {
        dVar1 = FmsAbs((double)(*(float *)(in_RDX + local_50 * 4) -
                               *(float *)(in_RCX + local_50 * 4)));
        if (1e-06 < dVar1) {
          local_30 = local_50 + 1;
          break;
        }
      }
      break;
    case 1:
      local_30 = 0;
      for (local_70 = 0; local_70 < in_RSI; local_70 = local_70 + 1) {
        dVar1 = FmsAbs(*(double *)(in_RDX + local_70 * 8) - *(double *)(in_RCX + local_70 * 8));
        if (1e-06 < dVar1) {
          local_30 = local_70 + 1;
          break;
        }
      }
      break;
    case 2:
      local_30 = 0;
      for (local_90 = 0; local_90 < in_RSI << 1; local_90 = local_90 + 1) {
        dVar1 = FmsAbs((double)(*(float *)(in_RDX + local_90 * 4) -
                               *(float *)(in_RCX + local_90 * 4)));
        if (1e-06 < dVar1) {
          local_30 = local_90 + 1;
          break;
        }
      }
      break;
    case 3:
      local_30 = 0;
      for (local_b0 = 0; local_b0 < in_RSI << 1; local_b0 = local_b0 + 1) {
        dVar1 = FmsAbs(*(double *)(in_RDX + local_b0 * 8) - *(double *)(in_RCX + local_b0 * 8));
        if (1e-06 < dVar1) {
          local_30 = local_b0 + 1;
          break;
        }
      }
      break;
    default:
      return 2;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

static inline FmsInt CompareScalarData(FmsScalarType stype, FmsInt size,
                                       const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(stype) {
  case FMS_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size, isDifferent);
    break;
  case FMS_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size, isDifferent);
    break;
  case FMS_COMPLEX_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size*2, isDifferent);
    break;
  case FMS_COMPLEX_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size*2, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}